

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_error
adios2_inquire_group_variables
          (adios2_variable ***variables,char *full_prefix,size_t *size,adios2_io *io)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  adios2_variable **ppaVar4;
  const_iterator cVar5;
  Variable *pVVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  adios2_variable **ppaVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_io, in call to adios2_inquire_all_variables","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)adios2::core::IO::GetVariables_abi_cxx11_();
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = strlen(full_prefix);
  plVar8 = *(long **)(this + 0x10);
  if (plVar8 == (long *)0x0) {
    *size = 0;
    ppaVar4 = (adios2_variable **)calloc(0,8);
  }
  else {
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,plVar8[1],plVar8[2] + plVar8[1])
      ;
      if (sVar1 < local_70._M_string_length) {
        strlen(full_prefix);
        lVar2 = std::__cxx11::string::find((char *)&local_70,(ulong)full_prefix,0);
        if ((lVar2 == 0) &&
           (uVar3 = std::__cxx11::string::rfind((char *)&local_70,0x12979f,0xffffffffffffffff),
           uVar3 <= sVar1)) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_a0,&local_70);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      p_Var7 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)0x0);
    *size = local_a0._M_impl.super__Rb_tree_header._M_node_count;
    ppaVar4 = (adios2_variable **)calloc(local_a0._M_impl.super__Rb_tree_header._M_node_count,8);
    ppaVar9 = ppaVar4;
    if ((_Rb_tree_header *)p_Var7 != &local_a0._M_impl.super__Rb_tree_header) {
      do {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this,(key_type *)(p_Var7 + 1));
        switch(*(undefined4 *)
                (*(long *)((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
                                 ._M_cur + 0x28) + 0x28)) {
        case 1:
          pVVar6 = adios2::core::IO::InquireVariable<signed_char>((string *)io);
          break;
        case 2:
          pVVar6 = adios2::core::IO::InquireVariable<short>((string *)io);
          break;
        case 3:
          pVVar6 = adios2::core::IO::InquireVariable<int>((string *)io);
          break;
        case 4:
          pVVar6 = adios2::core::IO::InquireVariable<long>((string *)io);
          break;
        case 5:
          pVVar6 = adios2::core::IO::InquireVariable<unsigned_char>((string *)io);
          break;
        case 6:
          pVVar6 = adios2::core::IO::InquireVariable<unsigned_short>((string *)io);
          break;
        case 7:
          pVVar6 = adios2::core::IO::InquireVariable<unsigned_int>((string *)io);
          break;
        case 8:
          pVVar6 = adios2::core::IO::InquireVariable<unsigned_long>((string *)io);
          break;
        case 9:
          pVVar6 = adios2::core::IO::InquireVariable<float>((string *)io);
          break;
        case 10:
          pVVar6 = adios2::core::IO::InquireVariable<double>((string *)io);
          break;
        case 0xb:
          pVVar6 = adios2::core::IO::InquireVariable<long_double>((string *)io);
          break;
        case 0xc:
          pVVar6 = adios2::core::IO::InquireVariable<std::complex<float>>((string *)io);
          break;
        case 0xd:
          pVVar6 = adios2::core::IO::InquireVariable<std::complex<double>>((string *)io);
          break;
        case 0xe:
          pVVar6 = adios2::core::IO::InquireVariable<std::__cxx11::string>((string *)io);
          break;
        case 0xf:
          pVVar6 = adios2::core::IO::InquireVariable<char>((string *)io);
          break;
        default:
          goto switchD_00118237_default;
        }
        *ppaVar9 = (adios2_variable *)pVVar6;
switchD_00118237_default:
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        ppaVar9 = ppaVar9 + 1;
      } while ((_Rb_tree_header *)p_Var7 != &local_a0._M_impl.super__Rb_tree_header);
    }
  }
  *variables = ppaVar4;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a0);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_inquire_group_variables(adios2_variable ***variables, const char *full_prefix,
                                            size_t *size, adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetVariables();

        // Sort the names so that we return the same order as the
        // C++, python APIs

        std::set<std::string> names;
        size_t prefix_size = strlen(full_prefix);
        for (auto &it : dataMap)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.rfind("/");
                if (pos <= prefix_size)
                {
                    names.insert(curr);
                }
            }
        }

        *size = names.size();
        adios2_variable **list = (adios2_variable **)calloc(*size, sizeof(adios2_variable *));

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::VariableBase *variable = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        variable = ioCpp.InquireVariable<T>(name);                                                 \
        list[n] = reinterpret_cast<adios2_variable *>(variable);                                   \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *variables = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}